

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerSettings.cpp
# Opt level: O2

void __thiscall SerialAnalyzerSettings::LoadSettings(SerialAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  bool use_autobaud;
  SimpleArchive text_archive;
  Mode mode;
  char *name_string;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&name_string);
  iVar2 = strcmp(name_string,"SaleaeAsyncSerialAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeAsyncSerialAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&this->mBitRate);
  SimpleArchive::operator>>(&text_archive,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(&text_archive,&this->mStopBits);
  SimpleArchive::operator>>(&text_archive,&this->mParity);
  SimpleArchive::operator>>(&text_archive,&this->mShiftOrder);
  SimpleArchive::operator>>(&text_archive,&this->mInverted);
  cVar1 = SimpleArchive::operator>>(&text_archive,&use_autobaud);
  if (cVar1 != '\0') {
    this->mUseAutobaud = use_autobaud;
  }
  cVar1 = SimpleArchive::operator>>(&text_archive,&mode);
  if (cVar1 != '\0') {
    this->mSerialMode = mode;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void SerialAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeAsyncSerialAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeAsyncSerialAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mBitsPerTransfer;
    text_archive >> mStopBits;
    text_archive >> *( U32* )&mParity;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mInverted;

    // check to make sure loading it actually works before assigning the result
    // do this when adding settings to an analyzer which has been previously released.
    bool use_autobaud;
    if( text_archive >> use_autobaud )
        mUseAutobaud = use_autobaud;

    SerialAnalyzerEnums::Mode mode;
    if( text_archive >> *( U32* )&mode )
        mSerialMode = mode;

    ClearChannels();
    AddChannel( mInputChannel, "Serial", true );

    UpdateInterfacesFromSettings();
}